

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_types.cpp
# Opt level: O1

void __thiscall
jaegertracing::sampling_manager::thrift::PerOperationSamplingStrategies::printTo
          (PerOperationSamplingStrategies *this,ostream *out)

{
  _PerOperationSamplingStrategies__isset _Var1;
  ostringstream o;
  char *local_1c0;
  long local_1b8;
  char local_1b0 [16];
  string local_1a0 [3];
  ios_base local_130 [264];
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"PerOperationSamplingStrategies(",0x1f);
  std::__ostream_insert<char,std::char_traits<char>>(out,"defaultSamplingProbability=",0x1b);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  *(undefined8 *)
   ((long)&local_1a0[0]._M_string_length + *(long *)(local_1a0[0]._M_dataplus._M_p + -0x18)) = 0x11;
  std::ostream::_M_insert<double>(this->defaultSamplingProbability);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  std::ios_base::~ios_base(local_130);
  std::__ostream_insert<char,std::char_traits<char>>(out,local_1c0,local_1b8);
  if (local_1c0 != local_1b0) {
    operator_delete(local_1c0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(out,"defaultLowerBoundTracesPerSecond=",0x21);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  *(undefined8 *)
   ((long)&local_1a0[0]._M_string_length + *(long *)(local_1a0[0]._M_dataplus._M_p + -0x18)) = 0x11;
  std::ostream::_M_insert<double>(this->defaultLowerBoundTracesPerSecond);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  std::ios_base::~ios_base(local_130);
  std::__ostream_insert<char,std::char_traits<char>>(out,local_1c0,local_1b8);
  if (local_1c0 != local_1b0) {
    operator_delete(local_1c0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(out,"perOperationStrategies=",0x17);
  apache::thrift::to_string<jaegertracing::sampling_manager::thrift::OperationSamplingStrategy>
            (local_1a0,&this->perOperationStrategies);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,local_1a0[0]._M_dataplus._M_p,local_1a0[0]._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0[0]._M_dataplus._M_p != &local_1a0[0].field_2) {
    operator_delete(local_1a0[0]._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(out,"defaultUpperBoundTracesPerSecond=",0x21);
  _Var1 = this->__isset;
  if (((byte)_Var1 & 1) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"<null>",6);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
    *(undefined8 *)
     ((long)&local_1a0[0]._M_string_length + *(long *)(local_1a0[0]._M_dataplus._M_p + -0x18)) =
         0x11;
    std::ostream::_M_insert<double>(this->defaultUpperBoundTracesPerSecond);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
    std::ios_base::~ios_base(local_130);
    std::__ostream_insert<char,std::char_traits<char>>(out,local_1c0,local_1b8);
  }
  if ((((byte)_Var1 & 1) != 0) && (local_1c0 != local_1b0)) {
    operator_delete(local_1c0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,")",1);
  return;
}

Assistant:

void PerOperationSamplingStrategies::printTo(std::ostream& out) const {
  using ::apache::thrift::to_string;
  out << "PerOperationSamplingStrategies(";
  out << "defaultSamplingProbability=" << to_string(defaultSamplingProbability);
  out << ", " << "defaultLowerBoundTracesPerSecond=" << to_string(defaultLowerBoundTracesPerSecond);
  out << ", " << "perOperationStrategies=" << to_string(perOperationStrategies);
  out << ", " << "defaultUpperBoundTracesPerSecond="; (__isset.defaultUpperBoundTracesPerSecond ? (out << to_string(defaultUpperBoundTracesPerSecond)) : (out << "<null>"));
  out << ")";
}